

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret get_options(uint64_t *bufs_alloc_size,uint32_t *bufs_count,uint64_t buf_size_max,
                    uint32_t threads)

{
  uint32_t threads_local;
  uint64_t buf_size_max_local;
  uint32_t *bufs_count_local;
  uint64_t *bufs_alloc_size_local;
  
  if ((threads < 0x4001) && (buf_size_max < 0x1000000000000)) {
    *bufs_count = threads << 1;
    *bufs_alloc_size = *bufs_count * buf_size_max;
    bufs_alloc_size_local._4_4_ = LZMA_OK;
  }
  else {
    bufs_alloc_size_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return bufs_alloc_size_local._4_4_;
}

Assistant:

static lzma_ret
get_options(const lzma_mt *options, lzma_options_easy *opt_easy,
		const lzma_filter **filters, uint64_t *block_size,
		uint64_t *outbuf_size_max)
{
	// Validate some of the options.
	if (options == NULL)
		return LZMA_PROG_ERROR;

	if (options->flags != 0 || options->threads == 0
			|| options->threads > LZMA_THREADS_MAX)
		return LZMA_OPTIONS_ERROR;

	if (options->filters != NULL) {
		// Filter chain was given, use it as is.
		*filters = options->filters;
	} else {
		// Use a preset.
		if (lzma_easy_preset(opt_easy, options->preset))
			return LZMA_OPTIONS_ERROR;

		*filters = opt_easy->filters;
	}

	// Block size
	if (options->block_size > 0) {
		if (options->block_size > BLOCK_SIZE_MAX)
			return LZMA_OPTIONS_ERROR;

		*block_size = options->block_size;
	} else {
		// Determine the Block size from the filter chain.
		*block_size = lzma_mt_block_size(*filters);
		if (*block_size == 0)
			return LZMA_OPTIONS_ERROR;

		assert(*block_size <= BLOCK_SIZE_MAX);
	}

	// Calculate the maximum amount output that a single output buffer
	// may need to hold. This is the same as the maximum total size of
	// a Block.
	*outbuf_size_max = lzma_block_buffer_bound64(*block_size);
	if (*outbuf_size_max == 0)
		return LZMA_MEM_ERROR;

	return LZMA_OK;
}